

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O2

void __thiscall QColumnView::selectAll(QColumnView *this)

{
  char cVar1;
  int iVar2;
  int iVar3;
  QAbstractItemModel *pQVar4;
  QItemSelectionModel *pQVar5;
  QAbstractItemModel *pQVar6;
  long in_FS_OFFSET;
  QItemSelectionRange QStack_e8;
  undefined1 *local_d8;
  undefined1 *puStack_d0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_c8;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_a8;
  QArrayDataPointer<QItemSelectionRange> local_98;
  undefined1 *local_78;
  undefined1 *puStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  QArrayDataPointer<QModelIndex> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = QAbstractItemView::model((QAbstractItemView *)this);
  if (pQVar4 != (QAbstractItemModel *)0x0) {
    pQVar5 = QAbstractItemView::selectionModel((QAbstractItemView *)this);
    if (pQVar5 != (QItemSelectionModel *)0x0) {
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
      QAbstractItemView::selectionModel((QAbstractItemView *)this);
      QItemSelectionModel::selectedIndexes();
      local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      QAbstractItemView::rootIndex((QModelIndex *)&local_78,(QAbstractItemView *)this);
      local_98.size = 0;
      local_98.d = (Data *)0x0;
      local_98.ptr = (QItemSelectionRange *)0x0;
      if ((undefined1 *)local_58.size != (undefined1 *)0x0) {
        QModelIndex::parent((QModelIndex *)&local_b8,local_58.ptr);
        local_68.ptr = local_a8.ptr;
        local_78 = local_b8;
        puStack_70 = puStack_b0;
        if ((undefined1 *)local_58.size == (undefined1 *)0x1) {
          local_78 = *(undefined1 **)local_58.ptr;
          puStack_70 = (undefined1 *)(local_58.ptr)->i;
          local_68.ptr = ((local_58.ptr)->m).ptr;
          pQVar4 = QAbstractItemView::model((QAbstractItemView *)this);
          cVar1 = (**(code **)(*(long *)pQVar4 + 0x88))(pQVar4,&local_78);
          if (cVar1 == '\0') {
            QModelIndex::parent((QModelIndex *)&local_b8,(QModelIndex *)&local_78);
            local_68.ptr = local_a8.ptr;
            local_78 = local_b8;
            puStack_70 = puStack_b0;
          }
          else {
            QItemSelectionRange::QItemSelectionRange
                      ((QItemSelectionRange *)&local_b8,(QModelIndex *)&local_78,
                       (QModelIndex *)&local_78);
            QList<QItemSelectionRange>::emplaceBack<QItemSelectionRange>
                      ((QList<QItemSelectionRange> *)&local_98,(QItemSelectionRange *)&local_b8);
            QItemSelectionRange::~QItemSelectionRange((QItemSelectionRange *)&local_b8);
          }
        }
      }
      local_a8.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_b8 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = QAbstractItemView::model((QAbstractItemView *)this);
      (**(code **)(*(long *)pQVar4 + 0x60))((QModelIndex *)&local_b8,pQVar4,0,0,&local_78);
      local_c8.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_d8 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = QAbstractItemView::model((QAbstractItemView *)this);
      pQVar6 = QAbstractItemView::model((QAbstractItemView *)this);
      iVar2 = (**(code **)(*(long *)pQVar6 + 0x78))(pQVar6,&local_78);
      pQVar6 = QAbstractItemView::model((QAbstractItemView *)this);
      iVar3 = (**(code **)(*(long *)pQVar6 + 0x80))(pQVar6,&local_78);
      (**(code **)(*(long *)pQVar4 + 0x60))
                ((QModelIndex *)&local_d8,pQVar4,iVar2 + -1,iVar3 + -1,&local_78);
      QItemSelectionRange::QItemSelectionRange
                (&QStack_e8,(QModelIndex *)&local_b8,(QModelIndex *)&local_d8);
      QList<QItemSelectionRange>::emplaceBack<QItemSelectionRange>
                ((QList<QItemSelectionRange> *)&local_98,&QStack_e8);
      QItemSelectionRange::~QItemSelectionRange(&QStack_e8);
      pQVar5 = QAbstractItemView::selectionModel((QAbstractItemView *)this);
      (**(code **)(*(long *)pQVar5 + 0x70))(pQVar5,&local_98,3);
      QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColumnView::selectAll()
{
    if (!model() || !selectionModel())
        return;

    QModelIndexList indexList = selectionModel()->selectedIndexes();
    QModelIndex parent = rootIndex();
    QItemSelection selection;
    if (indexList.size() >= 1)
        parent = indexList.at(0).parent();
    if (indexList.size() == 1) {
        parent = indexList.at(0);
        if (!model()->hasChildren(parent))
            parent = parent.parent();
        else
            selection.append(QItemSelectionRange(parent, parent));
    }

    QModelIndex tl = model()->index(0, 0, parent);
    QModelIndex br = model()->index(model()->rowCount(parent) - 1,
                                    model()->columnCount(parent) - 1,
                                    parent);
    selection.append(QItemSelectionRange(tl, br));
    selectionModel()->select(selection, QItemSelectionModel::ClearAndSelect);
}